

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

type cm::operator==(StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *l,char **r)

{
  bool bVar1;
  string_view __y;
  string local_48;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_28;
  char **local_18;
  char **r_local;
  StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *l_local;
  
  local_18 = r;
  r_local = (char **)l;
  StringOpPlus::operator_cast_to_string(&local_48,(StringOpPlus *)l);
  local_28 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  __y = AsStringView<char_*>::view(*local_18);
  bVar1 = std::operator==(local_28,__y);
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

typename std::enable_if<AsStringView<R>::value, bool>::type operator==(
  StringOpPlus<LL, LR> const& l, R&& r)
{
  return std::string(l) == AsStringView<R>::view(std::forward<R>(r));
}